

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::flipEdgeManual
          (SignpostIntrinsicTriangulation *this,Edge e,double newLength,double forwardAngle,
          double reverseAngle,bool isOrig,bool reverseFlip)

{
  double dVar1;
  Vector2 *pVVar2;
  bool bVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  runtime_error *this_00;
  double *pdVar6;
  ulong uVar7;
  size_t sVar8;
  double *pdVar9;
  uint uVar10;
  size_t i_3;
  ulong uVar11;
  size_t i;
  double dVar12;
  double dVar13;
  Face f;
  Face f_00;
  
  sVar8 = e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
  uVar10 = 0;
  do {
    bVar3 = SurfaceMesh::flip(&((this->intrinsicMesh)._M_t.
                                super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                .
                                super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>
                               ._M_head_impl)->super_SurfaceMesh,e,false);
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"could not perform manual flip");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  } while ((reverseFlip) && (bVar3 = uVar10 < 2, uVar10 = uVar10 + 1, bVar3));
  (this->intrinsicEdgeLengths).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data[sVar8] = newLength;
  (this->super_IntrinsicGeometryInterface).edgeLengths.data.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar8] = newLength
  ;
  bVar3 = (f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar3 == true) {
    pdVar6 = (this->intrinsicHalfedgeDirections).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar11 = sVar8 * 2;
    pdVar9 = pdVar6 + sVar8 * 2 + 1;
    pdVar9[-1] = forwardAngle;
  }
  else {
    uVar11 = ((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar8];
    pdVar6 = (this->intrinsicHalfedgeDirections).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pdVar6[uVar11] = forwardAngle;
    pdVar9 = pdVar6 + ((f.
                        super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                       .mesh)->heSiblingArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
  }
  *pdVar9 = reverseAngle;
  uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11];
  uVar7 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5];
  if (bVar3 == false) {
    uVar7 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7];
  }
  else {
    uVar7 = uVar7 ^ 1;
  }
  dVar13 = pdVar6[uVar11] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar5] /
                  *(double *)
                   (&DAT_00297340 +
                   (ulong)(((f.
                             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heFaceArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar7] <
                          (f.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->nFacesFillCount) * 8)));
  dVar12 = cos(dVar13);
  dVar13 = sin(dVar13);
  bVar3 = (f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar3 == true) {
    dVar1 = (this->intrinsicEdgeLengths).data.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar11 >> 1];
    pVVar2 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar11 = sVar8 * 2 + 1;
    pVVar2[sVar8 * 2].x = dVar1 * dVar12;
    pVVar2[sVar8 * 2].y = dVar13 * dVar1;
  }
  else {
    dVar1 = (this->intrinsicEdgeLengths).data.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11]];
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8];
    pVVar2 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pVVar2[uVar5].x = dVar1 * dVar12;
    pVVar2[uVar5].y = dVar13 * dVar1;
    uVar11 = ((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5];
  }
  uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11];
  uVar7 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5];
  if (bVar3 == false) {
    uVar7 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7];
  }
  else {
    uVar7 = uVar7 ^ 1;
  }
  dVar13 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar11] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar5] /
                  *(double *)
                   (&DAT_00297340 +
                   (ulong)(((f.
                             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heFaceArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar7] <
                          (f.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->nFacesFillCount) * 8)));
  dVar12 = cos(dVar13);
  dVar13 = sin(dVar13);
  if ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh)
      ->useImplicitTwinFlag == true) {
    uVar4 = sVar8 * 2;
    uVar5 = sVar8 * 2 + 1;
    pdVar9 = (this->intrinsicEdgeLengths).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             (uVar11 >> 1);
  }
  else {
    uVar4 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar8];
    pdVar9 = (this->intrinsicEdgeLengths).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             ((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11];
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar4];
  }
  dVar1 = *pdVar9;
  pVVar2 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar2[uVar5].x = dVar1 * dVar12;
  pVVar2[uVar5].y = dVar13 * dVar1;
  f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
        )->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar4];
  updateFaceBasis(this,f);
  if ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh)
      ->useImplicitTwinFlag == true) {
    uVar5 = sVar8 * 2 + 1;
  }
  else {
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start
            [((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar8]];
  }
  f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
        )->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar5];
  f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  updateFaceBasis(this,f_00);
  (this->edgeIsOriginal).data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage
  .m_data[sVar8] = isOrig;
  invokeEdgeFlipCallbacks(this,e);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::flipEdgeManual(Edge e, double newLength, double forwardAngle, double reverseAngle,
                                                    bool isOrig, bool reverseFlip) {

  int flipCount = reverseFlip ? 3 : 1; // three flips give opposite orientaiton
  for (int i = 0; i < flipCount; i++) {
    bool flipped = intrinsicMesh->flip(e, false);
    if (!flipped) throw std::runtime_error("could not perform manual flip");
  }

  intrinsicEdgeLengths[e] = newLength;
  edgeLengths[e] = newLength;

  // Update other derived geometric data
  intrinsicHalfedgeDirections[e.halfedge()] = forwardAngle;
  intrinsicHalfedgeDirections[e.halfedge().twin()] = reverseAngle;
  halfedgeVectorsInVertex[e.halfedge()] = halfedgeVector(e.halfedge());
  halfedgeVectorsInVertex[e.halfedge().twin()] = halfedgeVector(e.halfedge().twin());
  updateFaceBasis(e.halfedge().face());
  updateFaceBasis(e.halfedge().twin().face());

  edgeIsOriginal[e] = isOrig;
  invokeEdgeFlipCallbacks(e);
}